

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

int Bac_ObjAlloc(Bac_Ntk_t *p,Bac_ObjType_t Type,int Fanin)

{
  int Entry;
  int iVar1;
  int iVar2;
  int nCapMin;
  long lStack_30;
  
  Entry = (p->vType).nSize;
  if (Entry != (p->vFanin).nSize) {
    __assert_fail("iObj == Vec_IntSize(&p->vFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                  ,0x19f,"int Bac_ObjAlloc(Bac_Ntk_t *, Bac_ObjType_t, int)");
  }
  if (Type == BAC_OBJ_PI) {
    lStack_30 = 0x20;
  }
  else {
    if (Type != BAC_OBJ_PO) goto LAB_006e5bab;
    lStack_30 = 0x30;
  }
  Vec_IntPush((Vec_Int_t *)((long)&p->pDesign + lStack_30),Entry);
LAB_006e5bab:
  iVar1 = Abc_Var2Lit(Type,0);
  iVar2 = (p->vType).nSize;
  if (iVar2 == (p->vType).nCap) {
    nCapMin = 0x10;
    if (0xf < iVar2) {
      nCapMin = iVar2 * 2;
    }
    Vec_StrGrow(&p->vType,nCapMin);
    iVar2 = (p->vType).nSize;
  }
  (p->vType).nSize = iVar2 + 1;
  (p->vType).pArray[iVar2] = (char)iVar1;
  Vec_IntPush(&p->vFanin,Fanin);
  return Entry;
}

Assistant:

static inline int Bac_ObjAlloc( Bac_Ntk_t * p, Bac_ObjType_t Type, int Fanin )
{
    int iObj = Bac_NtkObjNum(p);
    assert( iObj == Vec_IntSize(&p->vFanin) );
    if ( Type == BAC_OBJ_PI )
        Vec_IntPush( &p->vInputs, iObj );
    else if ( Type == BAC_OBJ_PO )
        Vec_IntPush( &p->vOutputs, iObj );
    Vec_StrPush( &p->vType, (char)Abc_Var2Lit(Type, 0) );
    Vec_IntPush( &p->vFanin, Fanin );
    return iObj;
}